

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultEvaluator.cpp
# Opt level: O1

Block * navigate_object_tree(Block *parent,string *target,string *field_name)

{
  RuntimeException *this;
  long *plVar1;
  size_type *psVar2;
  ulong uVar3;
  long lVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hierarchy;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  anon_union_16_2_ba345be5_for_m_Storage local_e8;
  ulong local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90._M_dataplus._M_p = ".";
  local_90._M_string_length = 0x1cbf75;
  boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
            ((is_any_ofF<char> *)&local_e8,(iterator_range<const_char_*> *)&local_90);
  boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_any_ofF<char>>
            (&local_108,target,(is_any_ofF<char> *)&local_e8,token_compress_off);
  if ((0x10 < local_d8) && (local_e8.m_dynSet != (set_value_type *)0x0)) {
    operator_delete__(local_e8.m_dynSet);
  }
  if ((long)local_108.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_108.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5 != 1) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      parent = ninx::parser::element::Block::get_variable
                         (parent,(string *)
                                 ((long)&((local_108.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar4));
      if (parent == (Block *)0x0) {
        this = (RuntimeException *)__cxa_allocate_exception(0x38);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"TODO","");
        std::operator+(&local_70,"Object \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&((local_108.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar4));
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_d0._M_dataplus._M_p = (pointer)*plVar1;
        psVar2 = (size_type *)(plVar1 + 2);
        if ((size_type *)local_d0._M_dataplus._M_p == psVar2) {
          local_d0.field_2._M_allocated_capacity = *psVar2;
          local_d0.field_2._8_8_ = plVar1[3];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar2;
        }
        local_d0._M_string_length = plVar1[1];
        *plVar1 = (long)psVar2;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        std::operator+(&local_50,&local_d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&((local_108.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar4));
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_b0._M_dataplus._M_p = (pointer)*plVar1;
        psVar2 = (size_type *)(plVar1 + 2);
        if ((size_type *)local_b0._M_dataplus._M_p == psVar2) {
          local_b0.field_2._M_allocated_capacity = *psVar2;
          local_b0.field_2._8_8_ = plVar1[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar2;
        }
        local_b0._M_string_length = plVar1[1];
        *plVar1 = (long)psVar2;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        ninx::evaluator::exception::RuntimeException::RuntimeException(this,0,&local_90,&local_b0);
        __cxa_throw(this,&ninx::evaluator::exception::RuntimeException::typeinfo,
                    ninx::evaluator::exception::RuntimeException::~RuntimeException);
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x20;
    } while (uVar3 < ((long)local_108.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_108.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U);
  }
  std::__cxx11::string::_M_assign((string *)field_name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  return parent;
}

Assistant:

ninx::parser::element::Block * navigate_object_tree(ninx::parser::element::Block * parent, const std::string &target, std::string &field_name) {
    // Resolve the name, navigating the call hierarchy.
    std::vector<std::string> hierarchy;
    boost::split(hierarchy, target, boost::is_any_of("."));
    ninx::parser::element::Block * current_object {parent};
    for (int i = 0; i<hierarchy.size()-1; i++) {
        auto object {current_object->get_variable(hierarchy[i])};

        if (!object) {
            // TODO: add information of line number and origin
            throw ninx::evaluator::exception::RuntimeException(0, "TODO", "Object \""+hierarchy[i]+"\" does not have child '"+hierarchy[i]+"'!");
        }

        current_object = object;
    }

    field_name = hierarchy[hierarchy.size()-1];

    return current_object;
}